

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf_crypt_fuzzer.cc
# Opt level: O3

void __thiscall FuzzHelper::testWrite(FuzzHelper *this)

{
  undefined8 this_00;
  undefined8 this_01;
  undefined8 this_02;
  __uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_> this_03;
  undefined1 local_58 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  Pipeline *local_28;
  
  getQpdf((FuzzHelper *)local_58);
  this_01 = local_58._8_8_;
  local_38._8_8_ = local_58._0_8_;
  local_28 = (Pipeline *)local_58._8_8_;
  if ((Pipeline *)local_58._8_8_ != (Pipeline *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((string *)(local_58._8_8_ + 8))->_M_dataplus)._M_p =
           *(int *)&(((string *)(local_58._8_8_ + 8))->_M_dataplus)._M_p + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((string *)(local_58._8_8_ + 8))->_M_dataplus)._M_p =
           *(int *)&(((string *)(local_58._8_8_ + 8))->_M_dataplus)._M_p + 1;
    }
  }
  getWriter((FuzzHelper *)local_58,(shared_ptr<QPDF> *)this);
  this_02 = local_58._8_8_;
  this_00 = local_58._0_8_;
  local_58._0_8_ = (_Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>)0x0;
  local_58._8_8_ = (_func_int **)0x0;
  if (local_28 != (Pipeline *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
  }
  QPDFWriter::setStaticID((QPDFWriter *)this_00,true);
  QPDFWriter::setLinearization((QPDFWriter *)this_00,true);
  this_03._M_t.super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
  super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
       (tuple<Buffer::Members_*,_std::default_delete<Buffer::Members>_>)
       (tuple<Buffer::Members_*,_std::default_delete<Buffer::Members>_>)this_00;
  QPDFWriter::setR6EncryptionParameters
            ((QPDFWriter *)this_00,"u","o",true,true,true,true,true,true,qpdf_r3p_full,true);
  local_58._24_8_ = this_00;
  local_38._M_allocated_capacity = this_02;
  if ((Pipeline *)this_02 != (Pipeline *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((string *)(this_02 + 8))->_M_dataplus)._M_p =
           *(int *)&(((string *)(this_02 + 8))->_M_dataplus)._M_p + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((string *)(this_02 + 8))->_M_dataplus)._M_p =
           *(int *)&(((string *)(this_02 + 8))->_M_dataplus)._M_p + 1;
    }
  }
  doWrite((FuzzHelper *)
          this_03._M_t.
          super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
          super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl,
          (shared_ptr<QPDFWriter> *)(local_58 + 0x18));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_allocated_capacity);
  }
  if ((Pipeline *)this_02 != (Pipeline *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
  }
  if ((Pipeline *)this_01 != (Pipeline *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  return;
}

Assistant:

void
FuzzHelper::testWrite()
{
    // Write in various ways to exercise QPDFWriter

    std::shared_ptr<QPDF> q;
    std::shared_ptr<QPDFWriter> w;

    q = getQpdf();
    w = getWriter(q);
    w->setStaticID(true);
    w->setLinearization(true);
    w->setR6EncryptionParameters("u", "o", true, true, true, true, true, true, qpdf_r3p_full, true);
    doWrite(w);
}